

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

int Abc_NodeSetChoiceLevel_rec(Abc_Obj_t *pNode,int fMaximum)

{
  Abc_Ntk_t *pAVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  int in_EDX;
  int Fill;
  
  pAVar1 = pNode->pNtk;
  iVar4 = pNode->Id;
  Vec_IntFillExtra(&pAVar1->vTravIds,iVar4 + 1,in_EDX);
  if (((long)iVar4 < 0) || ((pAVar1->vTravIds).nSize <= iVar4)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar2 = pNode->pNtk;
  iVar3 = pAVar2->nTravIds;
  if ((pAVar1->vTravIds).pArray[iVar4] == iVar3) {
    iVar4 = (pNode->field_6).iTemp;
  }
  else {
    iVar4 = pNode->Id;
    Vec_IntFillExtra(&pAVar2->vTravIds,iVar4 + 1,Fill);
    if (((long)iVar4 < 0) || ((pAVar2->vTravIds).nSize <= iVar4)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar2->vTravIds).pArray[iVar4] = iVar3;
    iVar3 = Abc_NodeSetChoiceLevel_rec
                      ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],fMaximum);
    iVar4 = Abc_NodeSetChoiceLevel_rec
                      ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],fMaximum)
    ;
    if (iVar4 < iVar3) {
      iVar4 = iVar3;
    }
    iVar4 = iVar4 + 1;
    if ((Abc_Obj_t *)(pNode->field_5).pData != (Abc_Obj_t *)0x0) {
      iVar3 = Abc_NodeSetChoiceLevel_rec((Abc_Obj_t *)(pNode->field_5).pData,fMaximum);
      if (fMaximum == 0) {
        if (iVar3 <= iVar4) {
          iVar4 = iVar3;
        }
      }
      else if (iVar4 <= iVar3) {
        iVar4 = iVar3;
      }
      pvVar5 = (pNode->field_5).pData;
      if (pvVar5 != (void *)0x0) {
        do {
          *(long *)((long)pvVar5 + 0x40) = (long)iVar4;
          pvVar5 = *(void **)((long)pvVar5 + 0x38);
        } while (pvVar5 != (void *)0x0);
      }
    }
    pNode->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar4;
  }
  return iVar4;
}

Assistant:

int Abc_NodeSetChoiceLevel_rec( Abc_Obj_t * pNode, int fMaximum )
{
    Abc_Obj_t * pTemp;
    int Level1, Level2, Level, LevelE;
    // skip the visited node
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return (int)(ABC_PTRINT_T)pNode->pCopy;
    Abc_NodeSetTravIdCurrent( pNode );
    // compute levels of the children nodes
    Level1 = Abc_NodeSetChoiceLevel_rec( Abc_ObjFanin0(pNode), fMaximum );
    Level2 = Abc_NodeSetChoiceLevel_rec( Abc_ObjFanin1(pNode), fMaximum );
    Level  = 1 + Abc_MaxInt( Level1, Level2 );
    if ( pNode->pData )
    {
        LevelE = Abc_NodeSetChoiceLevel_rec( (Abc_Obj_t *)pNode->pData, fMaximum );
        if ( fMaximum )
            Level = Abc_MaxInt( Level, LevelE );
        else
            Level = Abc_MinInt( Level, LevelE );
        // set the level of all equivalent nodes to be the same minimum
        for ( pTemp = (Abc_Obj_t *)pNode->pData; pTemp; pTemp = (Abc_Obj_t *)pTemp->pData )
            pTemp->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)Level;
    }
    pNode->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)Level;
    return Level;
}